

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  shared_ptr<spdlog::logger> filelog;
  allocator *fmt;
  logger *this;
  allocator local_71;
  string local_70 [47];
  undefined1 in_stack_ffffffffffffffbf;
  filename_t *in_stack_ffffffffffffffc0;
  string *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = 0;
  spdlog::info<>((char *)0x1067be);
  spdlog::warn<>((char *)0x1067ca);
  spdlog::error<>((char *)0x1067d6);
  this = (logger *)&stack0xffffffffffffffc7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8,"sample-logger",(allocator *)this)
  ;
  fmt = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"sample-log.txt",fmt);
  spdlog::basic_logger_mt<spdlog::synchronous_factory>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,(bool)in_stack_ffffffffffffffbf);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  spdlog::logger::info<>(this,(char *)fmt);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  spdlog::logger::warn<>(this,(char *)fmt);
  std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  spdlog::logger::error<>(this,(char *)fmt);
  local_4 = 0;
  std::shared_ptr<spdlog::logger>::~shared_ptr((shared_ptr<spdlog::logger> *)0x1068c8);
  return local_4;
}

Assistant:

int main() {

  spdlog::info("Sample Info output.");
  spdlog::warn("Sample Warn output.");
  spdlog::error("Sample Error output.");

  auto filelog = spdlog::basic_logger_mt("sample-logger", "sample-log.txt");

  filelog.get()->info("Sample Info output.");
  filelog.get()->warn("Sample Warn output.");
  filelog.get()->error("Sample Error output.");

  return 0;
}